

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O0

uint UF::MemMerge(uint i,uint j)

{
  uint *puVar1;
  uint local_14;
  uint local_10;
  uint j_local;
  uint i_local;
  
  local_10 = i;
  while (puVar1 = MemVector<unsigned_int>::operator[](&mem_P_,local_10), local_14 = j,
        *puVar1 < local_10) {
    puVar1 = MemVector<unsigned_int>::operator[](&mem_P_,local_10);
    local_10 = *puVar1;
  }
  while (puVar1 = MemVector<unsigned_int>::operator[](&mem_P_,local_14), *puVar1 < local_14) {
    puVar1 = MemVector<unsigned_int>::operator[](&mem_P_,local_14);
    local_14 = *puVar1;
  }
  if (local_10 < local_14) {
    puVar1 = MemVector<unsigned_int>::operator[](&mem_P_,local_14);
    *puVar1 = local_10;
    j_local = local_10;
  }
  else {
    puVar1 = MemVector<unsigned_int>::operator[](&mem_P_,local_10);
    *puVar1 = local_14;
    j_local = local_14;
  }
  return j_local;
}

Assistant:

static unsigned MemMerge(unsigned i, unsigned j)
    {
        // FindRoot(i)
        while (mem_P_[i] < i) {
            i = mem_P_[i];
        }

        // FindRoot(j)
        while (mem_P_[j] < j) {
            j = mem_P_[j];
        }

        if (i < j)
            return mem_P_[j] = i;
        return mem_P_[i] = j;
    }